

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dense.hpp
# Opt level: O2

type * Disa::operator+(type *__return_storage_ptr__,Vector_Dense<double,_0UL> *vector0,
                      Vector_Dense<double,_3UL> *vector1)

{
  ostream *poVar1;
  source_location *in_RCX;
  _Any_data local_100;
  code *local_f0;
  code *local_e8;
  string local_e0;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  undefined **local_20;
  
  if ((long)(vector0->super_vector<double,_std::allocator<double>_>).
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)(vector0->super_vector<double,_std::allocator<double>_>).
            super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start == 0x18) {
    local_e8 = std::
               _Function_handler<double_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/vector_dense.hpp:324:25)>
               ::_M_invoke;
    local_f0 = std::
               _Function_handler<double_(unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/include/core/vector_dense.hpp:324:25)>
               ::_M_manager;
    local_100._M_unused._M_object = vector0;
    local_100._8_8_ = vector1;
    Vector_Dense<double,_3UL>::Vector_Dense
              (__return_storage_ptr__,(function<double_(unsigned_long)> *)&local_100,3);
    std::_Function_base::~_Function_base((_Function_base *)&local_100);
    return __return_storage_ptr__;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"\n");
  local_20 = &PTR_s__workspace_llm4binary_github_lic_001547f0;
  console_format_abi_cxx11_
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
             (Disa *)0x0,(Log_Level)&local_20,in_RCX);
  poVar1 = std::operator<<(poVar1,(string *)local_100._M_pod_data);
  std::__cxx11::to_string
            (&local_c0,
             (long)(vector0->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(vector0->super_vector<double,_std::allocator<double>_>).
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_a0,"Incompatible vector sizes, ",&local_c0);
  std::operator+(&local_80,&local_a0," vs. ");
  std::__cxx11::to_string(&local_e0,3);
  std::operator+(&local_60,&local_80,&local_e0);
  std::operator+(&local_40,&local_60,".");
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)local_100._M_pod_data);
  exit(1);
}

Assistant:

typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type constexpr operator+(
const Vector_Dense<_type, _size_0>& vector0, const Vector_Dense<_type, _size_1>& vector1) {
  ASSERT_DEBUG(vector0.size() == vector1.size(), "Incompatible vector sizes, " + std::to_string(vector0.size()) +
                                                 " vs. " + std::to_string(vector1.size()) + ".");
  typedef typename Static_Promoter<Vector_Dense<_type, _size_0>, Vector_Dense<_type, _size_1>>::type _return_vector;
  return _return_vector([&](const std::size_t ii) { return vector0[ii] + vector1[ii]; }, vector0.size());
}